

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerHeuristic.cpp
# Opt level: O0

bool Memory::RecyclerHeuristic::PartialConcurrentNextCollection
               (double ratio,ConfigFlagsTable *flags)

{
  bool bVar1;
  ConfigFlagsTable *flags_local;
  double ratio_local;
  
  bVar1 = Js::Phases::IsEnabled(&flags->Force,ConcurrentPartialCollectPhase);
  if (bVar1) {
    ratio_local._7_1_ = true;
  }
  else {
    bVar1 = Js::Phases::IsEnabled(&flags->Off,ConcurrentPartialCollectPhase);
    if (bVar1) {
      ratio_local._7_1_ = false;
    }
    else {
      ratio_local._7_1_ = 0.5 <= ratio;
    }
  }
  return ratio_local._7_1_;
}

Assistant:

bool
RecyclerHeuristic::PartialConcurrentNextCollection(double ratio, Js::ConfigFlagsTable& flags)
{
    if (CUSTOM_PHASE_FORCE1(flags, Js::ConcurrentPartialCollectPhase))
    {
        return true;
    }

    if (RECYCLER_HEURISTIC_VERSION == 10)
    {
        // Default off for version == 10
        if (!CUSTOM_PHASE_ON1(flags, Js::ConcurrentPartialCollectPhase))
        {
            return false;
        }
    }
    else
    {
        // Default on
        if (CUSTOM_PHASE_OFF1(flags, Js::ConcurrentPartialCollectPhase))
        {
            return false;
        }
    }
    return ratio >= 0.5;
}